

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O2

PHYSFS_Io * SZIP_openRead(void *opaque,char *path)

{
  uint uVar1;
  uint folderIndex;
  ulong outSize;
  long lVar2;
  long lVar3;
  SRes rc;
  PHYSFS_ErrorCode errcode;
  UInt32 UVar4;
  void *pvVar5;
  PHYSFS_Io *pPVar6;
  Byte *outBuffer;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __n;
  ISzAlloc *in_stack_ffffffffffffbf68;
  SZIPLookToRead stream;
  
  pvVar5 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar5 == (void *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  if (*(int *)((long)pvVar5 + 0x20) != 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    return (PHYSFS_Io *)0x0;
  }
  pPVar6 = (PHYSFS_Io *)(**(code **)(*(long *)((long)opaque + 0x28) + 0x38))();
  if (pPVar6 == (PHYSFS_Io *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  stream.lookStream.realStream = &stream.seekStream;
  stream.seekStream.Read = SZIP_ISeekInStream_Read;
  stream.seekStream.Seek = SZIP_ISeekInStream_Seek;
  stream.lookStream.pos = 0;
  stream.lookStream.size = 0;
  stream.lookStream.s.Look = LookToRead_Look_Exact;
  stream.lookStream.s.Skip = LookToRead_Skip;
  stream.lookStream.s.Read = LookToRead_Read;
  stream.lookStream.s.Seek = LookToRead_Seek;
  uVar1 = *(uint *)((long)pvVar5 + 0x28);
  uVar8 = (ulong)uVar1;
  folderIndex = *(uint *)(*(long *)((long)opaque + 0xf0) + uVar8 * 4);
  uVar9 = (ulong)folderIndex;
  stream.io = pPVar6;
  if (uVar9 == 0xffffffff) {
    outBuffer = (Byte *)0x0;
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
    outSize = *(ulong *)(*(long *)((long)opaque + 0x70) +
                        (ulong)((uint)*(byte *)(*(long *)((long)opaque + 0x68) + uVar9) +
                               *(int *)(*(long *)((long)opaque + 0x60) + uVar9 * 4)) * 8);
    outBuffer = (Byte *)0x0;
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
    if ((outSize == 0) ||
       (outBuffer = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,outSize), outBuffer != (Byte *)0x0))
    {
      rc = SzAr_DecodeFolder((CSzAr *)((long)opaque + 0x30),folderIndex,&stream.lookStream.s,
                             *(UInt64 *)((long)opaque + 0x88),outBuffer,outSize,
                             in_stack_ffffffffffffbf68);
      if (rc == 0) {
        lVar2 = *(long *)((long)opaque + 0x98);
        lVar7 = *(long *)(lVar2 + (ulong)*(uint *)(*(long *)((long)opaque + 0xe8) + uVar9 * 4) * 8);
        lVar3 = *(long *)(lVar2 + (ulong)(uVar1 + 1) * 8);
        if (outSize < (ulong)(lVar3 - lVar7)) {
          rc = 0xb;
        }
        else {
          lVar2 = *(long *)(lVar2 + uVar8 * 8);
          lVar7 = lVar2 - lVar7;
          __n = lVar3 - lVar2;
          if (((*(long *)((long)opaque + 0xa8) == 0) ||
              (-1 < (char)(*(char *)(*(long *)((long)opaque + 0xa8) + (ulong)(uVar1 >> 3)) <<
                          ((byte)uVar1 & 7)))) ||
             (UVar4 = (*g_CrcUpdate)(0xffffffff,outBuffer + lVar7,__n,g_CrcTable),
             (UVar4 ^ *(uint *)(*(long *)((long)opaque + 0xb0) + uVar8 * 4)) == 0xffffffff)) {
            if (outBuffer != (Byte *)0x0) {
              (*pPVar6->destroy)(pPVar6);
              pvVar5 = (*__PHYSFS_AllocatorHooks.Malloc)(__n + (__n == 0));
              if (pvVar5 != (void *)0x0) {
                if (lVar3 != lVar2) {
                  memcpy(pvVar5,outBuffer + lVar7,__n);
                }
                (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
                pPVar6 = __PHYSFS_createMemoryIo(pvVar5,__n,__PHYSFS_AllocatorHooks.Free);
                if (pPVar6 == (PHYSFS_Io *)0x0) {
                  (*__PHYSFS_AllocatorHooks.Free)(pvVar5);
                  return (PHYSFS_Io *)0x0;
                }
                return pPVar6;
              }
              PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
              goto LAB_0010dec3;
            }
            errcode = PHYSFS_ERR_OUT_OF_MEMORY;
            outBuffer = (Byte *)0x0;
            goto LAB_0010deaf;
          }
          rc = 3;
        }
      }
    }
    else {
      rc = 2;
      outBuffer = (Byte *)0x0;
    }
    errcode = szipErrorCode(rc);
  }
LAB_0010deaf:
  PHYSFS_setErrorCode(errcode);
  (*pPVar6->destroy)(pPVar6);
  if (outBuffer == (Byte *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
LAB_0010dec3:
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *SZIP_openRead(void *opaque, const char *path)
{
    /* !!! FIXME: the current lzma sdk C API only allows you to decompress
       !!! FIXME:  the entire file at once, which isn't ideal. Fix this in the
       !!! FIXME:  SDK and then convert this all to a streaming interface. */

    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPLookToRead stream;
    PHYSFS_Io *retval = NULL;
    PHYSFS_Io *io = NULL;
    UInt32 blockIndex = 0xFFFFFFFF;
    Byte *outBuffer = NULL;
    size_t outBufferSize = 0;
    size_t offset = 0;
    size_t outSizeProcessed = 0;
    void *buf = NULL;
    SRes rc;

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!io, SZIP_openRead_failed);

    szipInitStream(&stream, io);

    rc = SzArEx_Extract(&info->db, &stream.lookStream.s, entry->dbidx,
                        &blockIndex, &outBuffer, &outBufferSize, &offset,
                        &outSizeProcessed, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), SZIP_openRead_failed);
    GOTO_IF(outBuffer == NULL, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);

    io->destroy(io);
    io = NULL;

    buf = allocator.Malloc(outSizeProcessed ? outSizeProcessed : 1);
    GOTO_IF(buf == NULL, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);

    if (outSizeProcessed > 0)
        memcpy(buf, outBuffer + offset, outSizeProcessed);

    alloc->Free(alloc, outBuffer);
    outBuffer = NULL;

    retval = __PHYSFS_createMemoryIo(buf, outSizeProcessed, allocator.Free);
    GOTO_IF_ERRPASS(!retval, SZIP_openRead_failed);

    return retval;

SZIP_openRead_failed:
    if (io != NULL)
        io->destroy(io);

    if (buf)
        allocator.Free(buf);

    if (outBuffer)
        alloc->Free(alloc, outBuffer);

    return NULL;
}